

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Base.cpp
# Opt level: O2

void __thiscall adios2::format::BP5Base::BP5Base(BP5Base *this)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined **ppuVar4;
  FMField *pFVar5;
  byte bVar6;
  
  bVar6 = 0;
  memcpy(this,&DAT_006db4c8,0x88);
  lVar2 = 0xc;
  puVar3 = &DAT_00822cc8;
  pFVar5 = this->prim_attr_field_list;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    pFVar5->field_name = (char *)*puVar3;
    puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
    pFVar5 = (FMField *)((long)pFVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  puVar3 = &DAT_00822d28;
  pFVar5 = this->string_attr_field_list;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    pFVar5->field_name = (char *)*puVar3;
    puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
    pFVar5 = (FMField *)((long)pFVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  ppuVar4 = &PTR_anon_var_dwarf_aa7a36_00822d88;
  pFVar5 = this->bp5_attr_field_list;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    pFVar5->field_name = *ppuVar4;
    ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
    pFVar5 = (FMField *)((long)pFVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  this->attr_struct_list[0].format_name = "GenericAttributes";
  this->attr_struct_list[0].field_list = this->bp5_attr_field_list;
  this->attr_struct_list[0].struct_size = 0x20;
  this->attr_struct_list[0].opt_info = (FMOptInfo *)0x0;
  this->attr_struct_list[1].format_name = "PrimAttr";
  this->attr_struct_list[1].field_list = this->prim_attr_field_list;
  this->attr_struct_list[1].struct_size = 0x18;
  this->attr_struct_list[1].opt_info = (FMOptInfo *)0x0;
  this->attr_struct_list[2].format_name = "StrAttr";
  this->attr_struct_list[2].field_list = this->string_attr_field_list;
  this->attr_struct_list[2].struct_size = 0x18;
  this->attr_struct_list[3].opt_info = (FMOptInfo *)0x0;
  this->attr_struct_list[2].opt_info = (FMOptInfo *)0x0;
  this->attr_struct_list[3].format_name = (char *)0x0;
  *(undefined8 *)((long)&this->attr_struct_list[3].format_name + 4) = 0;
  *(undefined8 *)((long)&this->attr_struct_list[3].field_list + 4) = 0;
  this->MetaArrayRecListPtr = (FMField *)MetaArrayRecList;
  this->MetaArrayRecOperatorListPtr = (FMField *)MetaArrayRecOperatorList;
  this->MetaArrayRecMM1ListPtr = (FMField *)MetaArrayRecMM1List;
  this->MetaArrayRecOperatorMM1ListPtr = (FMField *)MetaArrayRecOperatorMM1List;
  this->MetaArrayRecMM2ListPtr = (FMField *)MetaArrayRecMM2List;
  this->MetaArrayRecOperatorMM2ListPtr = (FMField *)MetaArrayRecOperatorMM2List;
  this->MetaArrayRecMM4ListPtr = (FMField *)MetaArrayRecMM4List;
  this->MetaArrayRecOperatorMM4ListPtr = (FMField *)MetaArrayRecOperatorMM4List;
  this->MetaArrayRecMM8ListPtr = (FMField *)MetaArrayRecMM8List;
  this->MetaArrayRecOperatorMM8ListPtr = (FMField *)MetaArrayRecOperatorMM8List;
  this->MetaArrayRecMM16ListPtr = (FMField *)MetaArrayRecMM16List;
  this->MetaArrayRecOperatorMM16ListPtr = (FMField *)MetaArrayRecOperatorMM16List;
  return;
}

Assistant:

BP5Base::BP5Base()
{
    MetaArrayRecListPtr = &MetaArrayRecList[0];
    MetaArrayRecOperatorListPtr = &MetaArrayRecOperatorList[0];
    MetaArrayRecMM1ListPtr = &MetaArrayRecMM1List[0];
    MetaArrayRecOperatorMM1ListPtr = &MetaArrayRecOperatorMM1List[0];
    MetaArrayRecMM2ListPtr = &MetaArrayRecMM2List[0];
    MetaArrayRecOperatorMM2ListPtr = &MetaArrayRecOperatorMM2List[0];
    MetaArrayRecMM4ListPtr = &MetaArrayRecMM4List[0];
    MetaArrayRecOperatorMM4ListPtr = &MetaArrayRecOperatorMM4List[0];
    MetaArrayRecMM8ListPtr = &MetaArrayRecMM8List[0];
    MetaArrayRecOperatorMM8ListPtr = &MetaArrayRecOperatorMM8List[0];
    MetaArrayRecMM16ListPtr = &MetaArrayRecMM16List[0];
    MetaArrayRecOperatorMM16ListPtr = &MetaArrayRecOperatorMM16List[0];
}